

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascDecrypt.cpp
# Opt level: O1

int CascLoadEncryptionKeys(TCascStorage *hs)

{
  PCASC_MAP p_Var1;
  LPBYTE pBVar2;
  int iVar3;
  long lVar4;
  
  p_Var1 = Map_Create(0xf6,8,0);
  hs->pEncryptionKeys = p_Var1;
  iVar3 = 0xc;
  if (p_Var1 != (PCASC_MAP)0x0) {
    lVar4 = 0;
    do {
      Map_InsertObject(hs->pEncryptionKeys,CascKeys[0].Key + lVar4 + -8,CascKeys[0].Key + lVar4 + -8
                      );
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0xb10);
    pBVar2 = (LPBYTE)malloc(0xc00);
    (hs->ExtraKeysList).m_pItemArray = pBVar2;
    if (pBVar2 != (LPBYTE)0x0) {
      (hs->ExtraKeysList).m_ItemCountMax = 0x80;
      (hs->ExtraKeysList).m_ItemCount = 0;
      (hs->ExtraKeysList).m_ItemSize = 0x18;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int CascLoadEncryptionKeys(TCascStorage * hs)
{
    size_t nKeyCount = (sizeof(CascKeys) / sizeof(CASC_ENCRYPTION_KEY));
    size_t nMaxItems = nKeyCount + CASC_EXTRA_KEYS;
    int nError;

    // Create fast map of KeyName -> Key
    hs->pEncryptionKeys = Map_Create(nMaxItems, sizeof(ULONGLONG), FIELD_OFFSET(CASC_ENCRYPTION_KEY, KeyName));
    if (hs->pEncryptionKeys == NULL)
        return ERROR_NOT_ENOUGH_MEMORY;

    // Insert all static keys
    for (size_t i = 0; i < nKeyCount; i++)
        Map_InsertObject(hs->pEncryptionKeys, &CascKeys[i], &CascKeys[i].KeyName);

    // Create array for extra keys
    nError = hs->ExtraKeysList.Create<CASC_ENCRYPTION_KEY>(CASC_EXTRA_KEYS);
    return nError;
}